

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.h
# Opt level: O1

void __thiscall DeviceTy::DeviceTy(DeviceTy *this,DeviceTy *d)

{
  this->DeviceID = d->DeviceID;
  this->RTL = d->RTL;
  this->RTLDeviceID = d->RTLDeviceID;
  this->IsInit = d->IsInit;
  (this->InitFlag)._M_once = 0;
  this->HasPendingGlobals = d->HasPendingGlobals;
  std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::list
            (&this->HostDataToTargetMap,&d->HostDataToTargetMap);
  std::
  _Rb_tree<__tgt_bin_desc_*,_std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>,_std::_Select1st<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
  ::_Rb_tree(&(this->PendingCtorsDtors)._M_t,&(d->PendingCtorsDtors)._M_t);
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_ShadowPtrValTy>,_std::_Select1st<std::pair<void_*const,_ShadowPtrValTy>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  ::_Rb_tree(&(this->ShadowPtrMap)._M_t,&(d->ShadowPtrMap)._M_t);
  *(undefined8 *)((long)&(this->ShadowMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->ShadowMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->ShadowMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->ShadowMtx).super___mutex_base._M_mutex + 8) = 0;
  (this->PendingGlobalsMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->PendingGlobalsMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->PendingGlobalsMtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->PendingGlobalsMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->DataMapMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->PendingGlobalsMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->DataMapMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->DataMapMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->DataMapMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->DataMapMtx).super___mutex_base._M_mutex + 8) = 0;
  (this->ShadowMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::_Rb_tree(&(this->LoopTripCnt)._M_t,&(d->LoopTripCnt)._M_t);
  this->RTLRequiresFlags = d->RTLRequiresFlags;
  return;
}

Assistant:

DeviceTy(const DeviceTy &d)
      : DeviceID(d.DeviceID), RTL(d.RTL), RTLDeviceID(d.RTLDeviceID),
        IsInit(d.IsInit), InitFlag(), HasPendingGlobals(d.HasPendingGlobals),
        HostDataToTargetMap(d.HostDataToTargetMap),
        PendingCtorsDtors(d.PendingCtorsDtors), ShadowPtrMap(d.ShadowPtrMap),
        DataMapMtx(), PendingGlobalsMtx(),
        ShadowMtx(), LoopTripCnt(d.LoopTripCnt),
        RTLRequiresFlags(d.RTLRequiresFlags) {}